

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

TRef recff_sbufx_checkint(jit_State *J,RecordFFData *rd,int arg)

{
  TRef TVar1;
  uint tr;
  TRef TVar2;
  
  tr = J->base[arg];
  TVar1 = lj_ir_kint(J,0x7fffff00);
  if (4 < (tr >> 0x18 & 0x1f) - 0xf) {
    if ((tr & 0x1f000000) == 0xa000000) {
      TVar1 = lj_crecord_loadiu64(J,tr,rd->argv + arg);
      TVar2 = lj_ir_kint64(J,0x7fffff00);
      (J->fold).ins.field_0.ot = 0x696;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      lj_opt_fold(J);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
      TVar1 = lj_opt_fold(J);
      return TVar1;
    }
    if ((tr & 0x1f000000) != 0xe000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b13126e;
    tr = lj_opt_fold(J);
  }
  (J->fold).ins.field_0.ot = 0x693;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  lj_opt_fold(J);
  return tr;
}

Assistant:

static TRef recff_sbufx_checkint(jit_State *J, RecordFFData *rd, int arg)
{
  TRef tr = J->base[arg];
  TRef trlim = lj_ir_kint(J, LJ_MAX_BUF);
  if (tref_isinteger(tr)) {
    emitir(IRTGI(IR_ULE), tr, trlim);
  } else if (tref_isnum(tr)) {
    tr = emitir(IRTI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_ANY);
    emitir(IRTGI(IR_ULE), tr, trlim);
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    tr = lj_crecord_loadiu64(J, tr, &rd->argv[arg]);
    emitir(IRTG(IR_ULE, IRT_U64), tr, lj_ir_kint64(J, LJ_MAX_BUF));
    tr = emitir(IRTI(IR_CONV), tr, (IRT_INT<<5)|IRT_I64|IRCONV_NONE);
#else
    UNUSED(rd);
#endif
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}